

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr)

{
  int iVar1;
  int local_30;
  int bCmp;
  int nCmp;
  int nTerm;
  char *zTerm;
  Fts5VocabCursor *pFStack_10;
  int rc;
  Fts5VocabCursor *pCsr_local;
  
  zTerm._4_4_ = 0;
  if (pCsr->pIter->bEof == '\0') {
    pFStack_10 = pCsr;
    _nCmp = (u8 *)sqlite3Fts5IterTerm(pCsr->pIter,&bCmp);
    if (-1 < pFStack_10->nLeTerm) {
      if (bCmp < pFStack_10->nLeTerm) {
        local_30 = bCmp;
      }
      else {
        local_30 = pFStack_10->nLeTerm;
      }
      iVar1 = memcmp(pFStack_10->zLeTerm,_nCmp,(long)local_30);
      if ((iVar1 < 0) || ((iVar1 == 0 && (pFStack_10->nLeTerm < bCmp)))) {
        pFStack_10->bEof = 1;
      }
    }
    sqlite3Fts5BufferSet((int *)((long)&zTerm + 4),&pFStack_10->term,bCmp,_nCmp);
  }
  else {
    pCsr->bEof = 1;
  }
  return zTerm._4_4_;
}

Assistant:

static int fts5VocabInstanceNewTerm(Fts5VocabCursor *pCsr){
  int rc = SQLITE_OK;
  
  if( sqlite3Fts5IterEof(pCsr->pIter) ){
    pCsr->bEof = 1;
  }else{
    const char *zTerm;
    int nTerm;
    zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
    if( pCsr->nLeTerm>=0 ){
      int nCmp = MIN(nTerm, pCsr->nLeTerm);
      int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
      if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
        pCsr->bEof = 1;
      }
    }

    sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
  }
  return rc;
}